

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void invalid_get_byoffset_test(void)

{
  fdb_status fVar1;
  size_t sVar2;
  size_t sVar3;
  FILE *__stream;
  ssize_t sVar4;
  int iVar5;
  list *plVar6;
  ulong uVar7;
  char *__format;
  long lVar8;
  fdb_doc *local_13c8 [8];
  undefined1 local_1378 [8];
  uint8_t buf [4096];
  fdb_config local_370;
  char local_278 [8];
  char keybuf [256];
  char bodybuf [256];
  undefined1 local_70 [8];
  timeval __test_begin;
  fdb_file_handle *local_48;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  
  gettimeofday((timeval *)local_70,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  local_370.purging_interval = 1;
  local_370.seqtree_opt = '\x01';
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(&local_48,"./dummy1",&local_370);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11c6);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x11c6,"void invalid_get_byoffset_test()");
  }
  fVar1 = fdb_kvs_open(local_48,(fdb_kvs_handle **)&rdoc,(char *)0x0,
                       (fdb_kvs_config *)&__test_begin.tv_usec);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11c8);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x11c8,"void invalid_get_byoffset_test()");
  }
  fdb_set_log_callback((fdb_kvs_handle *)rdoc,functional_test_dummy_cb,(void *)0x0);
  builtin_strncpy(local_278,"key",4);
  builtin_strncpy(keybuf + 0xf8,"body",4);
  keybuf._252_2_ = (ushort)(byte)keybuf[0xfd] << 8;
  sVar2 = strlen(local_278);
  sVar3 = strlen(keybuf + 0xf8);
  local_13c8[7] = (fdb_doc *)0x1150b4;
  fdb_doc_create((fdb_doc **)&dbfile,local_278,sVar2,(void *)0x0,0,keybuf + 0xf8,sVar3);
  fVar1 = fdb_set((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11d6);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x11d6,"void invalid_get_byoffset_test()");
  }
  fdb_kvs_close((fdb_kvs_handle *)rdoc);
  fdb_close(local_48);
  fVar1 = fdb_open(&local_48,"./dummy1",&local_370);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11de);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x11de,"void invalid_get_byoffset_test()");
  }
  fVar1 = fdb_kvs_open(local_48,(fdb_kvs_handle **)&rdoc,(char *)0x0,
                       (fdb_kvs_config *)&__test_begin.tv_usec);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11e0);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x11e0,"void invalid_get_byoffset_test()");
  }
  fdb_set_log_callback((fdb_kvs_handle *)rdoc,functional_test_dummy_cb,(void *)0x0);
  fVar1 = fdb_get_byoffset((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
  if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11e7);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x11e7,"void invalid_get_byoffset_test()");
  }
  fdb_doc_free((fdb_doc *)dbfile);
  sVar2 = strlen(local_278);
  sVar3 = strlen(keybuf + 0xf8);
  local_13c8[7] = (fdb_doc *)0x115189;
  fdb_doc_create((fdb_doc **)&dbfile,local_278,sVar2,(void *)0x0,0,keybuf + 0xf8,sVar3);
  fVar1 = fdb_set((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11f4);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x11f4,"void invalid_get_byoffset_test()");
  }
  iVar5 = 1;
  for (lVar8 = 0; lVar8 != 0x50; lVar8 = lVar8 + 8) {
    sprintf(local_278,"key%d",iVar5);
    sprintf(keybuf + 0xf8,"val%d",iVar5);
    sVar2 = strlen(local_278);
    sVar3 = strlen(keybuf + 0xf8);
    fdb_doc_create((fdb_doc **)((long)local_13c8 + lVar8),local_278,sVar2,(void *)0x0,0,
                   keybuf + 0xf8,sVar3);
    fdb_set((fdb_kvs_handle *)rdoc,*(fdb_doc **)((long)local_13c8 + lVar8));
    iVar5 = iVar5 + 1;
  }
  fVar1 = fdb_commit(local_48,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1204);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x1204,"void invalid_get_byoffset_test()");
  }
  for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
    fdb_doc_free(local_13c8[lVar8]);
  }
  dbfile[1].handles = (list *)0xe8c031da89000391;
  fVar1 = fdb_get_byoffset((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
  if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1211);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x1211,"void invalid_get_byoffset_test()");
  }
  fdb_doc_free((fdb_doc *)dbfile);
  sVar2 = strlen(local_278);
  sVar3 = strlen(keybuf + 0xf8);
  fdb_doc_create((fdb_doc **)&dbfile,local_278,sVar2,(void *)0x0,0,keybuf + 0xf8,sVar3);
  fVar1 = fdb_set((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x121d);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x121d,"void invalid_get_byoffset_test()");
  }
  fVar1 = fdb_del((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1221);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x1221,"void invalid_get_byoffset_test()");
  }
  fdb_doc_free((fdb_doc *)dbfile);
  builtin_strncpy(local_278,"key0",5);
  builtin_strncpy(keybuf + 0xf8,"body0",6);
  sVar2 = strlen(local_278);
  sVar3 = strlen(keybuf + 0xf8);
  fdb_doc_create((fdb_doc **)&dbfile,local_278,sVar2,(void *)0x0,0,keybuf + 0xf8,sVar3);
  fVar1 = fdb_set((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x122b);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x122b,"void invalid_get_byoffset_test()");
  }
  fVar1 = fdb_commit(local_48,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x122f);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x122f,"void invalid_get_byoffset_test()");
  }
  fdb_compact(local_48,"./dummy2");
  fdb_kvs_close((fdb_kvs_handle *)rdoc);
  fdb_close(local_48);
  fVar1 = fdb_open(&local_48,"./dummy2",&local_370);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x123a);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x123a,"void invalid_get_byoffset_test()");
  }
  fVar1 = fdb_kvs_open(local_48,(fdb_kvs_handle **)&rdoc,(char *)0x0,
                       (fdb_kvs_config *)&__test_begin.tv_usec);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x123c);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x123c,"void invalid_get_byoffset_test()");
  }
  fdb_set_log_callback((fdb_kvs_handle *)rdoc,functional_test_dummy_cb,(void *)0x0);
  fVar1 = fdb_get_byoffset((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
  if (fVar1 != FDB_RESULT_READ_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1242);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_READ_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x1242,"void invalid_get_byoffset_test()");
  }
  __stream = fopen("./dummy2","r");
  plVar6 = (list *)0xfffffffffffff000;
  do {
    plVar6 = plVar6 + 0x100;
    iVar5 = fileno(__stream);
    sVar4 = pread(iVar5,local_1378,0x1000,(__off_t)plVar6);
    if (sVar4 != 0x1000) break;
  } while (buf[0xff7] != 0xff);
  fclose(__stream);
  dbfile[1].handles = plVar6;
  fVar1 = fdb_get_byoffset((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
  if (fVar1 != FDB_RESULT_READ_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x126f);
    invalid_get_byoffset_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_READ_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x126f,"void invalid_get_byoffset_test()");
  }
  iVar5 = rand();
  dbfile[1].handles = (list *)((long)&plVar6->head + (long)(iVar5 % 0x1000));
  fVar1 = fdb_get_byoffset((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
  if (fVar1 == FDB_RESULT_READ_FAIL) {
    fdb_doc_free((fdb_doc *)dbfile);
    fdb_begin_transaction(local_48,'\x02');
    for (uVar7 = 0; uVar7 != 100; uVar7 = uVar7 + 1) {
      sprintf(local_278,"k%06d",uVar7 & 0xffffffff);
      sprintf(keybuf + 0xf8,"v%06d",uVar7 & 0xffffffff);
      fdb_set_kv((fdb_kvs_handle *)rdoc,local_278,8,keybuf + 0xf8,8);
    }
    fdb_end_transaction(local_48,'\0');
    for (plVar6 = (list *)0x0; plVar6 != (list *)0x186a0; plVar6 = (list *)((long)&plVar6->head + 1)
        ) {
      sprintf(local_278,"k%06d",(ulong)plVar6 & 0xffffffff);
      fdb_doc_create((fdb_doc **)&dbfile,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
      dbfile[1].handles = plVar6;
      fdb_get_byoffset((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
      fdb_doc_free((fdb_doc *)dbfile);
    }
    fdb_kvs_close((fdb_kvs_handle *)rdoc);
    fdb_close(local_48);
    fdb_shutdown();
    memleak_end();
    __format = "%s PASSED\n";
    if (invalid_get_byoffset_test()::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"invalid get by-offset test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x1277);
  invalid_get_byoffset_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_READ_FAIL",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x1277,"void invalid_get_byoffset_test()");
}

Assistant:

void invalid_get_byoffset_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    char keybuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // open dbfile
    fconfig = fdb_get_default_config();
    fconfig.purging_interval = 1;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_set_log_callback(db, functional_test_dummy_cb, NULL);

    sprintf(keybuf, "key");
    sprintf(bodybuf, "body");

    /* Scenario 1: Fetch offset from empty file */

    {
        // Create a doc
        fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                NULL, 0, bodybuf, strlen(bodybuf));
        status = fdb_set(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // close db file
        fdb_kvs_close(db);
        fdb_close(dbfile);

        // open new dbfile
        status = fdb_open(&dbfile, "./dummy1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_set_log_callback(db, functional_test_dummy_cb, NULL);

        // attempt to get key by previous offset,
        // should fail as doc wasn't commited
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

        fdb_doc_free(rdoc);
    }

    /* Scenario 2: Fetch invalid offset that points to a different data block
       from same file */

    {
        // Create a doc
        fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                NULL, 0, bodybuf, strlen(bodybuf));
        status = fdb_set(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Write 10 additional documents
        fdb_doc **doc = alca(fdb_doc*, 10);
        int i;
        for (i = 0; i < 10; ++i) {
            sprintf(keybuf, "key%d", i+1);
            sprintf(bodybuf, "val%d", i+1);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                           NULL, 0, (void*)bodybuf, strlen(bodybuf));
            fdb_set(db, doc[i]);
        }
        uint64_t last_offset = doc[i-1]->offset;

        // Commit the doc so it goes into main index
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Free all the additional documents
        for (i = 0; i < 10; ++i) {
            fdb_doc_free(doc[i]);
        }

        // Incorrectly set rdoc's offset to the last saved doc's offset
        rdoc->offset = last_offset;

        // attempt to get key by incorrect offset belonging to a different
        // data block
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

        fdb_doc_free(rdoc);
    }

    /* Scenario 3: Fetch old offset from compacted file */

    {
        // Create doc
        fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                NULL, 0, bodybuf, strlen(bodybuf));
        status = fdb_set(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Delete the doc
        status = fdb_del(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_doc_free(rdoc);
        sprintf(keybuf, "key0");
        sprintf(bodybuf, "body0");

        // Create doc again
        fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                       NULL, 0, bodybuf, strlen(bodybuf));
        status = fdb_set(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Commit the doc so it goes into main index
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Compact file
        fdb_compact(dbfile, "./dummy2");

        // close db file
        fdb_kvs_close(db);
        fdb_close(dbfile);

        // open new dbfile
        status = fdb_open(&dbfile, "./dummy2", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_set_log_callback(db, functional_test_dummy_cb, NULL);

        // attempt to get key by incorrect offset belonging to different file
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_READ_FAIL);
    }

    /* Scenario 4: Fetch invalid offset that points to an index block
       on same file */

    {
        uint8_t buf[4096];
        FILE* fd = fopen("./dummy2", "r");
        int64_t offset = 0;
#if !defined(WIN32) && !defined(_WIN32)
        while (pread(fileno(fd), buf, 4096, offset) == 4096) {
            if (buf[4095] == BLK_MARKER_BNODE) {
                // This means this block was an index block
                // (last byte of the block is 0xff)
                break;
            }
            offset += 4096;
        }
        fclose(fd);
#else
        DWORD bytesread;
        OVERLAPPED winoffs;
        memset(&winoffs, 0, sizeof(winoffs));
        winoffs.Offset = offset & 0xFFFFFFFF;
        winoffs.OffsetHigh = ((uint64_t)offset >> 32) & 0x7FFFFFFF;
        while (ReadFile(fd, buf, 4096, &bytesread, &winoffs)) {
            if (buf[4095] == BLK_MARKER_BNODE) {
                // This means this block was an index block
                // (last byte of the block is 0xff)
                break;
            }
            offset += 4096;
            winoffs.Offset = offset & 0xFFFFFFFF;
            winoffs.OffsetHigh = ((uint64_t)offset >> 32) & 0x7FFFFFFF;
        }
        fclose(fd);
#endif

        // Set doc's offset to that of the index block
        rdoc->offset = offset;

        // attempt to get key by incorrect offset belonging to an index block
        // (offset points to start of an index block)
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_READ_FAIL);

        // Set doc's offset to a random spot within that index block
        rdoc->offset = offset + (rand() % 4096);

        // attempt to get key by incorrect offset belonging to an index block
        // (offset points to somewhere within the index block)
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_READ_FAIL);

        // Free the document
        fdb_doc_free(rdoc);
    }

    /* Scenario 5: Fetch invalid offset that points to a transaction commit marker
       on same file */
    {
        size_t i;

        // insert 100 docs using transaction
        fdb_begin_transaction(dbfile, FDB_ISOLATION_READ_COMMITTED);
        for (i=0;i<100;++i) {
            sprintf(keybuf, "k%06d", (int)i);
            sprintf(bodybuf, "v%06d", (int)i);
            fdb_set_kv(db, keybuf, 8, bodybuf, 8);
        }
        fdb_end_transaction(dbfile, FDB_COMMIT_NORMAL);

        // try to retrieve all possible offsets
        for (i=0;i<100000;++i) {
            sprintf(keybuf, "k%06d", (int)i);
            fdb_doc_create(&rdoc, NULL, 0 , NULL, 0, NULL, 0);
            rdoc->offset = i;
            fdb_get_byoffset(db, rdoc);
            fdb_doc_free(rdoc);
        }
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("invalid get by-offset test");
}